

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O3

void doTest(int w,int h,int *formats,int nformats,int subsamp,char *basename)

{
  uint subsamp_00;
  ulong uVar1;
  bool bVar2;
  long lVar3;
  tjhandle pvVar4;
  void *__s;
  uchar *puVar5;
  FILE *__s_00;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  uint uVar9;
  size_t sVar10;
  bool bVar11;
  undefined1 uVar12;
  ulong uVar13;
  undefined4 in_register_0000003c;
  void *pvVar14;
  char *pcVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  long lVar18;
  bool bVar19;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  int iVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  undefined1 auVar69 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  undefined1 auVar82 [16];
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int in_stack_fffffffffffffa68;
  uchar *dstBuf;
  ulong local_568;
  unsigned_long size;
  uchar *local_558;
  long lStack_550;
  long local_548;
  char *local_540;
  ulong local_538;
  char *local_530;
  tjhandle local_528;
  char *local_520;
  char *local_518;
  long local_510;
  size_t local_508;
  long lStack_500;
  uchar *local_4f8;
  long lStack_4f0;
  ulong local_4e8;
  char *local_4e0;
  long local_4d8;
  int *local_4d0;
  char *local_4c8;
  ulong local_4c0;
  long local_4b8;
  long lStack_4b0;
  long local_4a8;
  long lStack_4a0;
  long local_498;
  long lStack_490;
  undefined1 local_488 [16];
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  uint local_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  undefined1 local_448 [16];
  char local_438 [1032];
  
  pcVar7 = (char *)(ulong)(uint)subsamp;
  dstBuf = (uchar *)0x0;
  size = 0;
  local_4e0 = basename;
  local_4d0 = formats;
  if (((alloc == 0) && (size = tjBufSize(CONCAT44(in_register_0000003c,w),h,pcVar7), size != 0)) &&
     (dstBuf = (uchar *)tjAlloc(size & 0xffffffff), dstBuf == (uchar *)0x0)) {
    printf("ERROR: %s\n","Memory allocation failure.");
    exitStatus = -1;
  }
  else {
    lVar3 = tjInitCompress();
    if ((lVar3 == 0) || (pvVar4 = (tjhandle)tjInitDecompress(), pvVar4 == (tjhandle)0x0)) {
      uVar8 = tjGetErrorStr();
      pvVar4 = (tjhandle)0x0;
      printf("TurboJPEG ERROR:\n%s\n",uVar8);
      exitStatus = -1;
    }
    else {
      local_548 = lVar3;
      local_528 = pvVar4;
      if (0 < nformats) {
        uVar1 = (ulong)(uint)w;
        local_4e8 = (ulong)(uint)nformats;
        uVar13 = (ulong)(subsamp - 1);
        local_4c0 = (ulong)(w + 0xfU & 0xfffffff0);
        lVar3 = uVar1 - 1;
        local_488._8_4_ = (int)lVar3;
        local_488._0_8_ = lVar3;
        local_488._12_4_ = (int)((ulong)lVar3 >> 0x20);
        local_4d8 = (long)(h * w);
        local_538 = 0;
        local_568 = uVar13;
        local_540 = pcVar7;
        local_518 = pcVar7;
        do {
          bVar2 = false;
          bVar19 = true;
          do {
            bVar11 = bVar19;
            uVar9 = 0;
            if ((uint)uVar13 < 5) {
              uVar9 = *(uint *)(&DAT_001079c8 + uVar13 * 4);
            }
            subsamp_00 = uVar9 | 2;
            if (!bVar2) {
              subsamp_00 = uVar9;
            }
            bVar19 = (subsamp_00 & 2) == 0;
            local_530 = "Bottom-Up";
            if (bVar19) {
              local_530 = "Top-Down ";
            }
            iVar54 = local_4d0[local_538];
            lVar3 = (long)iVar54;
            local_4c8 = "BU";
            if (bVar19) {
              local_4c8 = "TD";
            }
            local_520 = pixFormatStr[lVar3];
            lVar18 = (long)tjPixelSize[lVar3];
            sVar10 = local_4d8 * lVar18;
            __s = malloc(sVar10);
            local_510 = lVar3;
            if (__s == (void *)0x0) {
              printf("ERROR: %s\n","Memory allocation failure");
LAB_00103c54:
              exitStatus = -1;
              puVar5 = (uchar *)0x0;
            }
            else {
              if (iVar54 == 0xb) {
                memset(__s,0xff,sVar10);
                if (0 < h) {
                  uVar9 = 0;
                  do {
                    if (0 < w) {
                      uVar51 = ~uVar9 + h;
                      if ((subsamp_00 & 2) == 0) {
                        uVar51 = uVar9;
                      }
                      puVar17 = (undefined1 *)((long)__s + lVar18 * (int)(uVar51 * w) + 3);
                      uVar13 = 0;
                      do {
                        if ((((uint)(uVar13 >> 3) & 0x1fffffff) + (uVar9 >> 3) & 1) == 0) {
                          puVar16 = puVar17;
                          if (0xf < uVar9) {
LAB_00103819:
                            *puVar16 = 0;
                          }
                        }
                        else {
                          puVar17[-1] = 0;
                          if (uVar9 < 0x10) {
                            puVar16 = (undefined1 *)
                                      ((long)__s + (uVar13 + (long)(int)(uVar51 * w)) * lVar18 + 1);
                            goto LAB_00103819;
                          }
                        }
                        uVar13 = uVar13 + 1;
                        puVar17 = puVar17 + lVar18;
                      } while (uVar1 != uVar13);
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 != h);
                }
              }
              else if (iVar54 == 6) {
                memset(__s,0,sVar10);
                if (0 < h) {
                  uVar9 = 0;
                  auVar38 = _DAT_001070d0;
                  do {
                    if (0 < w) {
                      uVar51 = ~uVar9 + h;
                      if ((subsamp_00 & 2) == 0) {
                        uVar51 = uVar9;
                      }
                      lVar3 = (long)(int)(uVar51 * w);
                      uVar12 = 0xe2;
                      if (uVar9 < 0x10) {
                        uVar12 = 0x4c;
                      }
                      local_458 = uVar9 >> 3;
                      uStack_454 = uVar9 >> 3;
                      uStack_450 = uVar9 >> 3;
                      uStack_44c = uVar9 >> 3;
                      iVar54 = -(uint)(uVar9 < 0x10);
                      uVar37 = (undefined1)((uint)iVar54 >> 0x18);
                      uVar36 = (undefined1)((uint)iVar54 >> 0x10);
                      uVar35 = (undefined1)((uint)iVar54 >> 8);
                      auVar60._4_4_ =
                           (int)(CONCAT35(CONCAT21(CONCAT11(uVar37,uVar37),uVar36),
                                          CONCAT14(uVar36,iVar54)) >> 0x20);
                      auVar60[3] = uVar35;
                      auVar60[2] = uVar35;
                      auVar60[0] = (undefined1)iVar54;
                      auVar60[1] = auVar60[0];
                      auVar60._8_8_ = 0;
                      auVar20 = pshuflw(auVar60,auVar60,0);
                      local_468 = auVar20._0_4_;
                      auVar20 = pshuflw(ZEXT216(CONCAT11(uVar12,uVar12)),
                                        ZEXT216(CONCAT11(uVar12,uVar12)),0);
                      local_478 = auVar20._0_4_;
                      uVar13 = 0;
                      local_498 = 2;
                      lStack_490 = 3;
                      local_4a8 = 4;
                      lStack_4a0 = 5;
                      local_4b8 = 6;
                      lStack_4b0 = 7;
                      local_558 = (uchar *)0x8;
                      lStack_550 = 9;
                      local_4f8 = (uchar *)0xa;
                      lStack_4f0 = 0xb;
                      local_508 = 0xc;
                      lStack_500 = 0xd;
                      uVar51 = 1;
                      uVar52 = 2;
                      uVar53 = 3;
                      uVar65 = 4;
                      uVar66 = 5;
                      uVar67 = 6;
                      uVar68 = 7;
                      uVar78 = 8;
                      uVar79 = 9;
                      uVar80 = 10;
                      uVar81 = 0xb;
                      uVar61 = 0xc;
                      uVar62 = 0xd;
                      uVar63 = 0xe;
                      uVar64 = 0xf;
                      auVar20 = _DAT_001070c0;
                      auVar69 = _DAT_00107050;
                      do {
                        local_448 = auVar20;
                        auVar20 = local_488 ^ auVar38;
                        auVar38 = local_448 ^ auVar38;
                        iVar83 = auVar20._0_4_;
                        iVar54 = -(uint)(iVar83 < auVar38._0_4_);
                        iVar84 = auVar20._4_4_;
                        auVar40._4_4_ = -(uint)(iVar84 < auVar38._4_4_);
                        iVar85 = auVar20._8_4_;
                        iVar59 = -(uint)(iVar85 < auVar38._8_4_);
                        iVar86 = auVar20._12_4_;
                        auVar40._12_4_ = -(uint)(iVar86 < auVar38._12_4_);
                        auVar42._4_4_ = iVar54;
                        auVar42._0_4_ = iVar54;
                        auVar42._8_4_ = iVar59;
                        auVar42._12_4_ = iVar59;
                        auVar20 = pshuflw(in_XMM4,auVar42,0xe8);
                        auVar39._4_4_ = -(uint)(auVar38._4_4_ == iVar84);
                        auVar39._12_4_ = -(uint)(auVar38._12_4_ == iVar86);
                        auVar39._0_4_ = auVar39._4_4_;
                        auVar39._8_4_ = auVar39._12_4_;
                        auVar70 = pshuflw(in_XMM11,auVar39,0xe8);
                        auVar40._0_4_ = auVar40._4_4_;
                        auVar40._8_4_ = auVar40._12_4_;
                        auVar60 = pshuflw(auVar20,auVar40,0xe8);
                        auVar71._0_4_ = -(uint)((local_458 & 1) == 0);
                        auVar71._4_4_ = -(uint)(((uVar51 >> 3) + uStack_454 & 1) == 0);
                        auVar71._8_4_ = -(uint)(((uVar52 >> 3) + uStack_450 & 1) == 0);
                        auVar71._12_4_ = -(uint)(((uVar53 >> 3) + uStack_44c & 1) == 0);
                        auVar72._0_4_ = -(uint)(((uVar65 >> 3) + local_458 & 1) == 0);
                        auVar72._4_4_ = -(uint)(((uVar66 >> 3) + uStack_454 & 1) == 0);
                        auVar72._8_4_ = -(uint)(((uVar67 >> 3) + uStack_450 & 1) == 0);
                        auVar72._12_4_ = -(uint)(((uVar68 >> 3) + uStack_44c & 1) == 0);
                        auVar38 = packssdw(auVar71,auVar72);
                        auVar73._0_4_ = -(uint)(((uVar78 >> 3) + local_458 & 1) == 0);
                        auVar73._4_4_ = -(uint)(((uVar79 >> 3) + uStack_454 & 1) == 0);
                        auVar73._8_4_ = -(uint)(((uVar80 >> 3) + uStack_450 & 1) == 0);
                        auVar73._12_4_ = -(uint)(((uVar81 >> 3) + uStack_44c & 1) == 0);
                        auVar82._0_4_ = -(uint)(((uVar61 >> 3) + local_458 & 1) == 0);
                        auVar82._4_4_ = -(uint)(((uVar62 >> 3) + uStack_454 & 1) == 0);
                        auVar82._8_4_ = -(uint)(((uVar63 >> 3) + uStack_450 & 1) == 0);
                        auVar82._12_4_ = -(uint)(((uVar64 >> 3) + uStack_44c & 1) == 0);
                        auVar74 = packssdw(auVar73,auVar82);
                        auVar71 = packsswb(auVar38,auVar74);
                        auVar74._4_4_ = local_468;
                        auVar74._0_4_ = local_468;
                        auVar74._8_4_ = local_468;
                        auVar74._12_4_ = local_468;
                        auVar38._4_4_ = local_478;
                        auVar38._0_4_ = local_478;
                        auVar38._8_4_ = local_478;
                        auVar38._12_4_ = local_478;
                        in_XMM11 = ~auVar71 & auVar38 | auVar74 & auVar71;
                        auVar75._8_4_ = 0xffffffff;
                        auVar75._0_8_ = 0xffffffffffffffff;
                        auVar75._12_4_ = 0xffffffff;
                        auVar38 = (auVar60 | auVar70 & auVar20) ^ auVar75;
                        auVar38 = packssdw(auVar38,auVar38);
                        if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(char *)((long)__s + uVar13 + lVar3) = in_XMM11[0];
                        }
                        auVar40 = auVar39 & auVar42 | auVar40;
                        auVar38 = packssdw(auVar40,auVar40);
                        auVar38 = packssdw(auVar38 ^ auVar75,auVar38 ^ auVar75);
                        auVar38 = packsswb(auVar38,auVar38);
                        auVar70._8_8_ = lStack_490;
                        auVar70._0_8_ = local_498;
                        if ((auVar38._0_4_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 1) = in_XMM11[1];
                        }
                        auVar38 = _DAT_001070d0;
                        auVar70 = auVar70 ^ _DAT_001070d0;
                        iVar54 = -(uint)(iVar83 < auVar70._0_4_);
                        auVar55._4_4_ = -(uint)(iVar84 < auVar70._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar70._8_4_);
                        auVar55._12_4_ = -(uint)(iVar86 < auVar70._12_4_);
                        auVar21._4_4_ = iVar54;
                        auVar21._0_4_ = iVar54;
                        auVar21._8_4_ = iVar59;
                        auVar21._12_4_ = iVar59;
                        auVar41._4_4_ = -(uint)(auVar70._4_4_ == iVar84);
                        auVar41._12_4_ = -(uint)(auVar70._12_4_ == iVar86);
                        auVar41._0_4_ = auVar41._4_4_;
                        auVar41._8_4_ = auVar41._12_4_;
                        auVar55._0_4_ = auVar55._4_4_;
                        auVar55._8_4_ = auVar55._12_4_;
                        auVar20 = auVar41 & auVar21 | auVar55;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packssdw(auVar20 ^ auVar75,auVar20 ^ auVar75);
                        auVar20 = packsswb(auVar20,auVar20);
                        auVar22._8_8_ = lStack_4a0;
                        auVar22._0_8_ = local_4a8;
                        auVar44._8_8_ = lStack_4b0;
                        auVar44._0_8_ = local_4b8;
                        if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 2) = in_XMM11[2];
                        }
                        auVar60 = pshufhw(auVar21,auVar21,0x84);
                        auVar42 = pshufhw(auVar41,auVar41,0x84);
                        auVar74 = pshufhw(auVar60,auVar55,0x84);
                        auVar60 = (auVar74 | auVar42 & auVar60) ^ auVar75;
                        auVar60 = packssdw(auVar60,auVar60);
                        auVar60 = packsswb(auVar60,auVar60);
                        if ((auVar60._0_4_ >> 0x18 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 3) = in_XMM11[3];
                        }
                        auVar22 = auVar22 ^ auVar38;
                        iVar54 = -(uint)(iVar83 < auVar22._0_4_);
                        auVar24._4_4_ = -(uint)(iVar84 < auVar22._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar22._8_4_);
                        auVar24._12_4_ = -(uint)(iVar86 < auVar22._12_4_);
                        auVar43._4_4_ = iVar54;
                        auVar43._0_4_ = iVar54;
                        auVar43._8_4_ = iVar59;
                        auVar43._12_4_ = iVar59;
                        auVar20 = pshuflw(auVar20,auVar43,0xe8);
                        auVar23._4_4_ = -(uint)(auVar22._4_4_ == iVar84);
                        auVar23._12_4_ = -(uint)(auVar22._12_4_ == iVar86);
                        auVar23._0_4_ = auVar23._4_4_;
                        auVar23._8_4_ = auVar23._12_4_;
                        auVar74 = pshuflw(auVar75,auVar23,0xe8);
                        auVar24._0_4_ = auVar24._4_4_;
                        auVar24._8_4_ = auVar24._12_4_;
                        auVar60 = pshuflw(auVar20,auVar24,0xe8);
                        auVar76._8_4_ = 0xffffffff;
                        auVar76._0_8_ = 0xffffffffffffffff;
                        auVar76._12_4_ = 0xffffffff;
                        auVar20 = (auVar60 | auVar74 & auVar20) ^ auVar76;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 4) = in_XMM11[4];
                        }
                        auVar24 = auVar23 & auVar43 | auVar24;
                        auVar20 = packssdw(auVar24,auVar24);
                        auVar20 = packssdw(auVar20 ^ auVar76,auVar20 ^ auVar76);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20._4_2_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 5) = in_XMM11[5];
                        }
                        auVar44 = auVar44 ^ auVar38;
                        iVar54 = -(uint)(iVar83 < auVar44._0_4_);
                        auVar56._4_4_ = -(uint)(iVar84 < auVar44._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar44._8_4_);
                        auVar56._12_4_ = -(uint)(iVar86 < auVar44._12_4_);
                        auVar25._4_4_ = iVar54;
                        auVar25._0_4_ = iVar54;
                        auVar25._8_4_ = iVar59;
                        auVar25._12_4_ = iVar59;
                        auVar45._4_4_ = -(uint)(auVar44._4_4_ == iVar84);
                        auVar45._12_4_ = -(uint)(auVar44._12_4_ == iVar86);
                        auVar45._0_4_ = auVar45._4_4_;
                        auVar45._8_4_ = auVar45._12_4_;
                        auVar56._0_4_ = auVar56._4_4_;
                        auVar56._8_4_ = auVar56._12_4_;
                        auVar20 = auVar45 & auVar25 | auVar56;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packssdw(auVar20 ^ auVar76,auVar20 ^ auVar76);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          *(char *)((long)__s + uVar13 + lVar3 + 6) = in_XMM11[6];
                        }
                        auVar60 = pshufhw(auVar25,auVar25,0x84);
                        auVar42 = pshufhw(auVar45,auVar45,0x84);
                        auVar74 = pshufhw(auVar60,auVar56,0x84);
                        auVar60 = (auVar74 | auVar42 & auVar60) ^ auVar76;
                        auVar60 = packssdw(auVar60,auVar60);
                        auVar60 = packsswb(auVar60,auVar60);
                        if ((auVar60._6_2_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 7) = in_XMM11[7];
                        }
                        auVar26._8_8_ = lStack_550;
                        auVar26._0_8_ = local_558;
                        auVar26 = auVar26 ^ auVar38;
                        iVar54 = -(uint)(iVar83 < auVar26._0_4_);
                        auVar28._4_4_ = -(uint)(iVar84 < auVar26._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar26._8_4_);
                        auVar28._12_4_ = -(uint)(iVar86 < auVar26._12_4_);
                        auVar46._4_4_ = iVar54;
                        auVar46._0_4_ = iVar54;
                        auVar46._8_4_ = iVar59;
                        auVar46._12_4_ = iVar59;
                        auVar20 = pshuflw(auVar20,auVar46,0xe8);
                        auVar27._4_4_ = -(uint)(auVar26._4_4_ == iVar84);
                        auVar27._12_4_ = -(uint)(auVar26._12_4_ == iVar86);
                        auVar27._0_4_ = auVar27._4_4_;
                        auVar27._8_4_ = auVar27._12_4_;
                        auVar74 = pshuflw(auVar76,auVar27,0xe8);
                        auVar28._0_4_ = auVar28._4_4_;
                        auVar28._8_4_ = auVar28._12_4_;
                        auVar60 = pshuflw(auVar20,auVar28,0xe8);
                        auVar77._8_4_ = 0xffffffff;
                        auVar77._0_8_ = 0xffffffffffffffff;
                        auVar77._12_4_ = 0xffffffff;
                        auVar20 = (auVar60 | auVar74 & auVar20) ^ auVar77;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 8) = in_XMM11[8];
                        }
                        auVar28 = auVar27 & auVar46 | auVar28;
                        auVar20 = packssdw(auVar28,auVar28);
                        auVar20 = packssdw(auVar20 ^ auVar77,auVar20 ^ auVar77);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20._8_2_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 9) = in_XMM11[9];
                        }
                        auVar47._8_8_ = lStack_4f0;
                        auVar47._0_8_ = local_4f8;
                        auVar47 = auVar47 ^ auVar38;
                        iVar54 = -(uint)(iVar83 < auVar47._0_4_);
                        auVar57._4_4_ = -(uint)(iVar84 < auVar47._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar47._8_4_);
                        auVar57._12_4_ = -(uint)(iVar86 < auVar47._12_4_);
                        auVar29._4_4_ = iVar54;
                        auVar29._0_4_ = iVar54;
                        auVar29._8_4_ = iVar59;
                        auVar29._12_4_ = iVar59;
                        auVar48._4_4_ = -(uint)(auVar47._4_4_ == iVar84);
                        auVar48._12_4_ = -(uint)(auVar47._12_4_ == iVar86);
                        auVar48._0_4_ = auVar48._4_4_;
                        auVar48._8_4_ = auVar48._12_4_;
                        auVar57._0_4_ = auVar57._4_4_;
                        auVar57._8_4_ = auVar57._12_4_;
                        auVar20 = auVar48 & auVar29 | auVar57;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packssdw(auVar20 ^ auVar77,auVar20 ^ auVar77);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 10) = in_XMM11[10];
                        }
                        auVar60 = pshufhw(auVar29,auVar29,0x84);
                        auVar42 = pshufhw(auVar48,auVar48,0x84);
                        auVar74 = pshufhw(auVar60,auVar57,0x84);
                        auVar60 = (auVar74 | auVar42 & auVar60) ^ auVar77;
                        auVar60 = packssdw(auVar60,auVar60);
                        auVar60 = packsswb(auVar60,auVar60);
                        if ((auVar60._10_2_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 0xb) = in_XMM11[0xb];
                        }
                        auVar30._8_8_ = lStack_500;
                        auVar30._0_8_ = local_508;
                        auVar30 = auVar30 ^ auVar38;
                        iVar54 = -(uint)(iVar83 < auVar30._0_4_);
                        auVar32._4_4_ = -(uint)(iVar84 < auVar30._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar30._8_4_);
                        auVar32._12_4_ = -(uint)(iVar86 < auVar30._12_4_);
                        auVar49._4_4_ = iVar54;
                        auVar49._0_4_ = iVar54;
                        auVar49._8_4_ = iVar59;
                        auVar49._12_4_ = iVar59;
                        auVar20 = pshuflw(auVar20,auVar49,0xe8);
                        auVar31._4_4_ = -(uint)(auVar30._4_4_ == iVar84);
                        auVar31._12_4_ = -(uint)(auVar30._12_4_ == iVar86);
                        auVar31._0_4_ = auVar31._4_4_;
                        auVar31._8_4_ = auVar31._12_4_;
                        auVar74 = pshuflw(auVar77,auVar31,0xe8);
                        auVar32._0_4_ = auVar32._4_4_;
                        auVar32._8_4_ = auVar32._12_4_;
                        auVar60 = pshuflw(auVar20,auVar32,0xe8);
                        auVar34._8_4_ = 0xffffffff;
                        auVar34._0_8_ = 0xffffffffffffffff;
                        auVar34._12_4_ = 0xffffffff;
                        auVar20 = (auVar60 | auVar74 & auVar20) ^ auVar34;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 0xc) = in_XMM11[0xc];
                        }
                        auVar32 = auVar31 & auVar49 | auVar32;
                        auVar20 = packssdw(auVar32,auVar32);
                        auVar20 = packssdw(auVar20 ^ auVar34,auVar20 ^ auVar34);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20._12_2_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 0xd) = in_XMM11[0xd];
                        }
                        auVar20 = auVar69 ^ auVar38;
                        iVar54 = -(uint)(iVar83 < auVar20._0_4_);
                        auVar58._4_4_ = -(uint)(iVar84 < auVar20._4_4_);
                        iVar59 = -(uint)(iVar85 < auVar20._8_4_);
                        auVar58._12_4_ = -(uint)(iVar86 < auVar20._12_4_);
                        auVar33._4_4_ = iVar54;
                        auVar33._0_4_ = iVar54;
                        auVar33._8_4_ = iVar59;
                        auVar33._12_4_ = iVar59;
                        auVar50._4_4_ = -(uint)(auVar20._4_4_ == iVar84);
                        auVar50._12_4_ = -(uint)(auVar20._12_4_ == iVar86);
                        auVar50._0_4_ = auVar50._4_4_;
                        auVar50._8_4_ = auVar50._12_4_;
                        auVar58._0_4_ = auVar58._4_4_;
                        auVar58._8_4_ = auVar58._12_4_;
                        auVar20 = auVar50 & auVar33 | auVar58;
                        auVar20 = packssdw(auVar20,auVar20);
                        auVar20 = packssdw(auVar20 ^ auVar34,auVar20 ^ auVar34);
                        in_XMM4 = packsswb(auVar20,auVar20);
                        if ((in_XMM4 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          *(char *)((long)__s + uVar13 + lVar3 + 0xe) = in_XMM11[0xe];
                        }
                        auVar20 = pshufhw(auVar33,auVar33,0x84);
                        auVar74 = pshufhw(auVar50,auVar50,0x84);
                        auVar60 = pshufhw(auVar20,auVar58,0x84);
                        auVar34 = (auVar60 | auVar74 & auVar20) ^ auVar34;
                        auVar20 = packssdw(auVar34,auVar34);
                        auVar20 = packsswb(auVar20,auVar20);
                        if ((auVar20._14_2_ >> 8 & 1) != 0) {
                          *(char *)((long)__s + uVar13 + lVar3 + 0xf) = in_XMM11[0xf];
                        }
                        uVar13 = uVar13 + 0x10;
                        auVar20._0_8_ = local_448._0_8_ + 0x10;
                        auVar20._8_8_ = local_448._8_8_ + 0x10;
                        local_498 = local_498 + 0x10;
                        lStack_490 = lStack_490 + 0x10;
                        local_4a8 = local_4a8 + 0x10;
                        lStack_4a0 = lStack_4a0 + 0x10;
                        local_4b8 = local_4b8 + 0x10;
                        lStack_4b0 = lStack_4b0 + 0x10;
                        local_558 = local_558 + 0x10;
                        lStack_550 = lStack_550 + 0x10;
                        local_4f8 = local_4f8 + 0x10;
                        lStack_4f0 = lStack_4f0 + 0x10;
                        local_508 = local_508 + 0x10;
                        lStack_500 = lStack_500 + 0x10;
                        lVar18 = auVar69._8_8_;
                        auVar69._0_8_ = auVar69._0_8_ + 0x10;
                        auVar69._8_8_ = lVar18 + 0x10;
                        uVar51 = uVar51 + 0x10;
                        uVar52 = uVar52 + 0x10;
                        uVar53 = uVar53 + 0x10;
                        uVar65 = uVar65 + 0x10;
                        uVar66 = uVar66 + 0x10;
                        uVar67 = uVar67 + 0x10;
                        uVar68 = uVar68 + 0x10;
                        uVar78 = uVar78 + 0x10;
                        uVar79 = uVar79 + 0x10;
                        uVar80 = uVar80 + 0x10;
                        uVar81 = uVar81 + 0x10;
                        uVar61 = uVar61 + 0x10;
                        uVar62 = uVar62 + 0x10;
                        uVar63 = uVar63 + 0x10;
                        uVar64 = uVar64 + 0x10;
                        uStack_474 = local_478;
                        uStack_470 = local_478;
                        uStack_46c = local_478;
                        uStack_464 = local_468;
                        uStack_460 = local_468;
                        uStack_45c = local_468;
                      } while (local_4c0 != uVar13);
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 != h);
                }
              }
              else {
                iVar54 = tjRedOffset[lVar3];
                iVar59 = tjGreenOffset[lVar3];
                iVar83 = tjBlueOffset[lVar3];
                memset(__s,0,sVar10);
                if (0 < h) {
                  uVar9 = 0;
                  do {
                    if (0 < w) {
                      uVar51 = ~uVar9 + h;
                      if ((subsamp_00 & 2) == 0) {
                        uVar51 = uVar9;
                      }
                      pvVar14 = (void *)(lVar18 * (int)(uVar51 * w) + (long)__s);
                      uVar13 = 0;
                      do {
                        if ((((uint)(uVar13 >> 3) & 0x1fffffff) + (uVar9 >> 3) & 1) == 0) {
                          if (uVar9 < 0x10) {
                            *(undefined1 *)((long)pvVar14 + (long)iVar54) = 0xff;
                            *(undefined1 *)((long)pvVar14 + (long)iVar59) = 0xff;
                            puVar17 = (undefined1 *)((long)pvVar14 + (long)iVar83);
LAB_001038e8:
                            *puVar17 = 0xff;
                          }
                        }
                        else {
                          *(undefined1 *)((long)pvVar14 + (long)iVar54) = 0xff;
                          if (0xf < uVar9) {
                            puVar17 = (undefined1 *)
                                      ((long)__s +
                                      (uVar13 + (long)(int)(uVar51 * w)) * lVar18 + (long)iVar59);
                            goto LAB_001038e8;
                          }
                        }
                        uVar13 = uVar13 + 1;
                        pvVar14 = (void *)((long)pvVar14 + lVar18);
                      } while (uVar1 != uVar13);
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 != h);
                }
              }
              if ((dstBuf != (uchar *)0x0) && (size != 0)) {
                memset(dstBuf,0,size);
              }
              pcVar15 = local_518;
              pcVar7 = local_540;
              uVar9 = subsamp_00 | 0x400;
              if (alloc != 0) {
                uVar9 = subsamp_00;
              }
              if (doYUV == 0) {
                printf("%s %s -> %s Q%d ... ",local_520,local_530,subNameLong[(long)local_540],100);
                iVar54 = tjCompress2(local_548,__s,w,0,h,local_510,&dstBuf,&size,pcVar15,100,uVar9);
                if (iVar54 == -1) goto LAB_00103c29;
                local_558 = (uchar *)0x0;
LAB_00103b59:
                uVar13 = local_568;
                snprintf(local_438,0x400,"%s_enc_%s_%s_%s_Q%d.jpg",local_4e0,local_520,local_4c8,
                         subName[(long)local_540],100);
                local_4f8 = dstBuf;
                local_508 = size;
                __s_00 = fopen(local_438,"wb");
                if (__s_00 == (FILE *)0x0) {
                  piVar6 = __errno_location();
                  pcVar7 = strerror(*piVar6);
                  printf("ERROR: Could not write to %s.\n%s\n",local_438,pcVar7);
                  exitStatus = -1;
                }
                else {
                  sVar10 = fwrite(local_4f8,local_508,1,__s_00);
                  if (sVar10 != 1) {
                    piVar6 = __errno_location();
                    pcVar7 = strerror(*piVar6);
                    printf("ERROR: Could not write to %s.\n%s\n",local_438,pcVar7);
                    exitStatus = -1;
                  }
                  fclose(__s_00);
                }
                printf("Done.\n  Result in %s\n",local_438);
                puVar5 = local_558;
              }
              else {
                sVar10 = tjBufSizeYUV2(w,pad,h,(ulong)local_518 & 0xffffffff);
                lVar3 = tjInitCompress();
                if (lVar3 == 0) {
LAB_00103c29:
                  uVar8 = tjGetErrorStr();
                  printf("TurboJPEG ERROR:\n%s\n",uVar8);
                  uVar13 = local_568;
                  goto LAB_00103c54;
                }
                puVar5 = (uchar *)calloc(1,sVar10);
                if (puVar5 == (uchar *)0x0) {
                  printf("ERROR: %s\n","Memory allocation failure");
                  exitStatus = -1;
                  puVar5 = (uchar *)0x0;
                  uVar13 = local_568;
                }
                else {
                  printf("%s %s -> YUV %s ... ",local_520,local_530,subNameLong[(long)pcVar7]);
                  pcVar7 = local_518;
                  local_558 = puVar5;
                  iVar54 = tjEncodeYUV3(lVar3,__s,CONCAT44(in_register_0000003c,w),0,h,local_510,
                                        puVar5,pad,local_518,uVar9);
                  if (iVar54 != -1) {
                    tjDestroy(lVar3);
                    puVar5 = local_558;
                    iVar54 = checkBufYUV(local_558,w,h,(int)pcVar7,(tjscalingfactor)0x100000001);
                    pcVar15 = "Passed.";
                    if (iVar54 == 0) {
                      pcVar15 = "FAILED!";
                    }
                    puts(pcVar15);
                    printf("YUV %s %s -> JPEG Q%d ... ",subNameLong[(long)local_540],local_530,100);
                    iVar54 = tjCompressFromYUV(local_548,puVar5,w,pad,h,(ulong)pcVar7 & 0xffffffff,
                                               &dstBuf,&size,100,uVar9);
                    if (iVar54 != -1) goto LAB_00103b59;
                  }
                  uVar8 = tjGetErrorStr();
                  printf("TurboJPEG ERROR:\n%s\n",uVar8);
                  exitStatus = -1;
                  puVar5 = local_558;
                  uVar13 = local_568;
                }
              }
            }
            free(puVar5);
            free(__s);
            pcVar7 = local_518;
            iVar54 = (int)local_510;
            decompTest(local_528,dstBuf,size,w,h,iVar54,local_518,subsamp_00,
                       in_stack_fffffffffffffa68);
            if (iVar54 - 2U < 4) {
              putchar(10);
              decompTest(local_528,dstBuf,size,w,h,iVar54 + 5,pcVar7,subsamp_00,
                         in_stack_fffffffffffffa68);
            }
            putchar(10);
            bVar2 = true;
            bVar19 = false;
          } while (bVar11);
          local_538 = local_538 + 1;
        } while (local_538 != local_4e8);
      }
      puts("--------------------\n");
      pvVar4 = local_528;
      lVar3 = local_548;
    }
    if (lVar3 != 0) {
      tjDestroy(lVar3);
    }
    if (pvVar4 != (tjhandle)0x0) {
      tjDestroy(pvVar4);
    }
  }
  tjFree(dstBuf);
  return;
}

Assistant:

static void doTest(int w, int h, const int *formats, int nformats, int subsamp,
                   char *basename)
{
  tjhandle chandle = NULL, dhandle = NULL;
  unsigned char *dstBuf = NULL;
  unsigned long size = 0;
  int pfi, pf, i;

  if (!alloc)
    size = tjBufSize(w, h, subsamp);
  if (size != 0)
    if ((dstBuf = (unsigned char *)tjAlloc(size)) == NULL)
      THROW("Memory allocation failure.");

  if ((chandle = tjInitCompress()) == NULL ||
      (dhandle = tjInitDecompress()) == NULL)
    THROW_TJ();

  for (pfi = 0; pfi < nformats; pfi++) {
    for (i = 0; i < 2; i++) {
      int flags = 0;

      if (subsamp == TJSAMP_422 || subsamp == TJSAMP_420 ||
          subsamp == TJSAMP_440 || subsamp == TJSAMP_411)
        flags |= TJFLAG_FASTUPSAMPLE;
      if (i == 1) flags |= TJFLAG_BOTTOMUP;
      pf = formats[pfi];
      compTest(chandle, &dstBuf, &size, w, h, pf, basename, subsamp, 100,
               flags);
      decompTest(dhandle, dstBuf, size, w, h, pf, basename, subsamp, flags);
      if (pf >= TJPF_RGBX && pf <= TJPF_XRGB) {
        printf("\n");
        decompTest(dhandle, dstBuf, size, w, h, pf + (TJPF_RGBA - TJPF_RGBX),
                   basename, subsamp, flags);
      }
      printf("\n");
    }
  }
  printf("--------------------\n\n");

bailout:
  if (chandle) tjDestroy(chandle);
  if (dhandle) tjDestroy(dhandle);
  tjFree(dstBuf);
}